

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contacts.cc
# Opt level: O0

void RigidBodyDynamics::ForwardDynamicsAccelerationDeltas
               (Model *model,ConstraintSet *CS,VectorNd *QDDot_t,uint body_id,
               vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *f_t)

{
  Scalar SVar1;
  uint uVar2;
  size_type sVar3;
  Scalar *pSVar4;
  reference pvVar5;
  reference pvVar6;
  Scalar *pSVar7;
  uint in_ECX;
  long in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *in_R8;
  ReturnType RVar8;
  double dVar9;
  Vector3d qdd_temp;
  SpatialVector Xa;
  uint lambda_2;
  uint q_index;
  uint i_5;
  uint i_4;
  uint i_3;
  uint i_2;
  uint lambda_1;
  uint lambda;
  uint i_1;
  uint i;
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  *in_stack_fffffffffffffaf8;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_fffffffffffffb00;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffb08;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_fffffffffffffb10;
  DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_fffffffffffffb18;
  MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
  *in_stack_fffffffffffffb20;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffb28;
  double *in_stack_fffffffffffffb40;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_fffffffffffffb48;
  SpatialVector *in_stack_fffffffffffffc80;
  SpatialTransform *in_stack_fffffffffffffc88;
  SpatialVector *in_stack_fffffffffffffcc0;
  SpatialTransform *in_stack_fffffffffffffcc8;
  uint local_2b8;
  uint local_2b4;
  uint local_2b0;
  uint local_2ac;
  uint local_30;
  uint local_2c;
  
  for (local_2c = 0;
      sVar3 = std::
              vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
              size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    *)&in_RDI[0x20].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish), local_30 = in_ECX,
      local_2c < sVar3; local_2c = local_2c + 1) {
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               (in_RSI + 0x268),(ulong)local_2c);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffffb00);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               (in_RSI + 0x280),(ulong)local_2c);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffffb00);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffffb00,(Index)in_stack_fffffffffffffaf8);
    *pSVar4 = 0.0;
    std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator[]
              ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(in_RSI + 0x2e8),(ulong)local_2c);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffb00);
  }
  for (; local_30 != 0; local_30 = local_30 - 1) {
    if (local_30 == in_ECX) {
      std::
      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                    *)(in_RDI + 0x1e),(ulong)local_30);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                (in_R8,(ulong)local_30);
      Math::SpatialTransform::applyAdjoint(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator-(in_stack_fffffffffffffb18);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 (in_RSI + 0x268),(ulong)local_30);
      SpatialVector_t::operator=
                ((SpatialVector_t *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    }
    pvVar5 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)&in_RDI[6].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(ulong)local_30);
    if (pvVar5->mDoFCount == 3) {
      std::
      vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
      ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    *)&in_RDI[0xe].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_30);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::transpose
                ((DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)in_stack_fffffffffffffaf8);
      Eigen::DenseBase<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>::operator-
                ((DenseBase<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_> *)
                 in_stack_fffffffffffffb18);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 (in_RSI + 0x268),(ulong)local_30);
      Eigen::
      MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>const>>
      ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>_>
                   *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
      std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator[]
                ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(in_RSI + 0x2e8),(ulong)local_30);
      Vector3_t::operator=
                ((Vector3_t *)in_stack_fffffffffffffb00,
                 (MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                  *)in_stack_fffffffffffffaf8);
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (in_RDI,(ulong)local_30);
      uVar2 = *pvVar6;
      if (uVar2 != 0) {
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   (in_RSI + 0x268),(ulong)uVar2);
        std::
        vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
        ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                      *)(in_RDI + 0x1d),(ulong)local_30);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   (in_RSI + 0x268),(ulong)local_30);
        std::
        vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
        ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      *)&in_RDI[0xf].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_30);
        std::vector<Matrix3_t,_std::allocator<Matrix3_t>_>::operator[]
                  ((vector<Matrix3_t,_std::allocator<Matrix3_t>_> *)
                   &in_RDI[0x10].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_30);
        Eigen::MatrixBase<Eigen::Matrix<double,6,3,0,6,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)in_stack_fffffffffffffb00,
                   (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffaf8);
        std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator[]
                  ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(in_RSI + 0x2e8),(ulong)local_30
                  );
        Eigen::
        MatrixBase<Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,3,0,3,3>,0>>
        ::operator*((MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
                     *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
        Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                  ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffffb28,
                   (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                    *)in_stack_fffffffffffffb20);
        SpatialVector_t::
        SpatialVector_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
                  ((SpatialVector_t *)in_stack_fffffffffffffb00,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                    *)in_stack_fffffffffffffaf8);
        Math::SpatialTransform::applyTranspose(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
        Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                  ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffffb28,
                   (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffffb20);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   (in_RSI + 0x268),(ulong)uVar2);
        SpatialVector_t::operator=
                  ((SpatialVector_t *)in_stack_fffffffffffffb00,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                    *)in_stack_fffffffffffffaf8);
      }
    }
    else {
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &in_RDI[7].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(ulong)local_30);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 (in_RSI + 0x268),(ulong)local_30);
      RVar8 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::
              dot<Eigen::Matrix<double,6,1,0,6,1>>
                        (in_stack_fffffffffffffb00,
                         (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                         in_stack_fffffffffffffaf8);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_fffffffffffffb00,(Index)in_stack_fffffffffffffaf8);
      *pSVar4 = -RVar8;
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (in_RDI,(ulong)local_30);
      uVar2 = *pvVar6;
      if (uVar2 != 0) {
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   (in_RSI + 0x268),(ulong)uVar2);
        std::
        vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
        ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                      *)(in_RDI + 0x1d),(ulong)local_30);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   (in_RSI + 0x268),(ulong)local_30);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   &in_RDI[0x16].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_30);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                  ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                   in_stack_fffffffffffffb00,(Index)in_stack_fffffffffffffaf8);
        Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator*
                  (in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                  ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                   in_stack_fffffffffffffb00,(Index)in_stack_fffffffffffffaf8);
        Eigen::
        MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>>
        ::operator/((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
                     *)in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
        Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                  ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffffb28,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
                    *)in_stack_fffffffffffffb20);
        SpatialVector_t::
        SpatialVector_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const>>
                  ((SpatialVector_t *)in_stack_fffffffffffffb00,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>_>
                    *)in_stack_fffffffffffffaf8);
        Math::SpatialTransform::applyTranspose(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
        Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                  ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffffb28,
                   (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffffb20);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   (in_RSI + 0x268),(ulong)uVar2);
        SpatialVector_t::operator=
                  ((SpatialVector_t *)in_stack_fffffffffffffb00,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                    *)in_stack_fffffffffffffaf8);
      }
    }
  }
  for (local_2ac = 0;
      sVar3 = std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::size(in_R8),
      local_2ac < sVar3; local_2ac = local_2ac + 1) {
  }
  for (local_2b0 = 0;
      sVar3 = std::
              vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
              size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    *)&in_RDI[0x20].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish), local_2b0 < sVar3;
      local_2b0 = local_2b0 + 1) {
  }
  for (local_2b4 = 0;
      sVar3 = std::
              vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
              size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    *)&in_RDI[0x20].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish), local_2b4 < sVar3;
      local_2b4 = local_2b4 + 1) {
  }
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                      in_stack_fffffffffffffb00,(Index)in_stack_fffffffffffffaf8);
  *pSVar4 = 0.0;
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             &in_RDI[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)(in_RSI + 0x280)
             ,0);
  SpatialVector_t::operator=
            ((SpatialVector_t *)in_stack_fffffffffffffb00,
             (SpatialVector_t *)in_stack_fffffffffffffaf8);
  for (local_2b8 = 1;
      sVar3 = std::
              vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
              size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    *)&in_RDI[0x20].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish), local_2b8 < sVar3;
      local_2b8 = local_2b8 + 1) {
    std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
    operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                *)&in_RDI[6].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage,(ulong)local_2b8);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_RDI,(ulong)local_2b8);
    uVar2 = *pvVar6;
    std::
    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
    ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                  *)(in_RDI + 0x1d),(ulong)local_2b8);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               (in_RSI + 0x280),(ulong)uVar2);
    Math::SpatialTransform::apply(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
    pvVar5 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)&in_RDI[6].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(ulong)local_2b8);
    if (pvVar5->mDoFCount == 3) {
      in_stack_fffffffffffffb28 =
           (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
           std::vector<Matrix3_t,_std::allocator<Matrix3_t>_>::operator[]
                     ((vector<Matrix3_t,_std::allocator<Matrix3_t>_> *)
                      &in_RDI[0x10].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_2b8);
      in_stack_fffffffffffffb20 =
           (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
            *)std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator[]
                        ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(in_RSI + 0x2e8),
                         (ulong)local_2b8);
      std::
      vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
      ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    *)&in_RDI[0xf].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_2b8);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::transpose
                ((DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)in_stack_fffffffffffffaf8);
      Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>>::operator*
                ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_> *)
                 in_stack_fffffffffffffb00,
                 (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffffaf8);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
                (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
      Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffb18,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>_>
                  *)in_stack_fffffffffffffb10);
      Vector3_t::
      Vector3_t<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,Eigen::Matrix<double,6,1,0,6,1>,0>const>,0>>
                ((Vector3_t *)in_stack_fffffffffffffb00,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_0>_>
                  *)in_stack_fffffffffffffaf8);
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          in_stack_fffffffffffffb00,(Index)in_stack_fffffffffffffaf8);
      SVar1 = *pSVar7;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_fffffffffffffb00,(Index)in_stack_fffffffffffffaf8);
      *pSVar4 = SVar1;
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          in_stack_fffffffffffffb00,(Index)in_stack_fffffffffffffaf8);
      SVar1 = *pSVar7;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_fffffffffffffb00,(Index)in_stack_fffffffffffffaf8);
      *pSVar4 = SVar1;
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          in_stack_fffffffffffffb00,(Index)in_stack_fffffffffffffaf8);
      in_stack_fffffffffffffb40 = (double *)*pSVar7;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_fffffffffffffb00,(Index)in_stack_fffffffffffffaf8);
      *pSVar4 = (Scalar)in_stack_fffffffffffffb40;
      in_stack_fffffffffffffb48 =
           (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
           std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                     ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                      &in_RDI[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_2b8);
      std::
      vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
      ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    *)&in_RDI[0xe].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_2b8);
      Eigen::MatrixBase<Eigen::Matrix<double,6,3,0,6,3>>::operator*
                ((MatrixBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)in_stack_fffffffffffffb00,
                 (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffaf8);
      Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffffb28,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                  *)in_stack_fffffffffffffb20);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &in_RDI[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(ulong)local_2b8);
      SpatialVector_t::operator=
                ((SpatialVector_t *)in_stack_fffffffffffffb00,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                  *)in_stack_fffffffffffffaf8);
      std::
      vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
      ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    *)&in_RDI[0xe].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_2b8);
      Eigen::MatrixBase<Eigen::Matrix<double,6,3,0,6,3>>::operator*
                ((MatrixBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)in_stack_fffffffffffffb00,
                 (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffaf8);
      Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffffb28,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                  *)in_stack_fffffffffffffb20);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 (in_RSI + 0x280),(ulong)local_2b8);
      SpatialVector_t::operator=
                ((SpatialVector_t *)in_stack_fffffffffffffb00,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                  *)in_stack_fffffffffffffaf8);
    }
    else {
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_fffffffffffffb00,(Index)in_stack_fffffffffffffaf8);
      in_stack_fffffffffffffb00 = (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)*pSVar4;
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &in_RDI[0x16].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_2b8);
      RVar8 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::
              dot<Eigen::Matrix<double,6,1,0,6,1>>
                        (in_stack_fffffffffffffb00,
                         (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                         in_stack_fffffffffffffaf8);
      dVar9 = (double)in_stack_fffffffffffffb00 - RVar8;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_fffffffffffffb00,(Index)in_stack_fffffffffffffaf8);
      in_stack_fffffffffffffb10 =
           (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)(dVar9 / *pSVar4);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_fffffffffffffb00,(Index)in_stack_fffffffffffffaf8);
      *pSVar4 = (Scalar)in_stack_fffffffffffffb10;
      in_stack_fffffffffffffb18 =
           (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
           std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                     ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                      &in_RDI[7].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_2b8);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                 in_stack_fffffffffffffb00,(Index)in_stack_fffffffffffffaf8);
      Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator*
                (in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
      Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffffb28,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
                  *)in_stack_fffffffffffffb20);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 (in_RSI + 0x280),(ulong)local_2b8);
      SpatialVector_t::operator=
                ((SpatialVector_t *)in_stack_fffffffffffffb00,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>_>
                  *)in_stack_fffffffffffffaf8);
    }
  }
  return;
}

Assistant:

RBDL_DLLAPI
void ForwardDynamicsAccelerationDeltas (
		Model &model,
		ConstraintSet &CS,
		VectorNd &QDDot_t,
		const unsigned int body_id,
		const std::vector<SpatialVector> &f_t
		) {
	LOG << "-------- " << __func__ << " ------" << std::endl;

	assert (CS.d_pA.size() == model.mBodies.size());
	assert (CS.d_a.size() == model.mBodies.size());
	assert (CS.d_u.size() == model.mBodies.size());

	// TODO reset all values (debug)
	for (unsigned int i = 0; i < model.mBodies.size(); i++) {
		CS.d_pA[i].setZero();
		CS.d_a[i].setZero();
		CS.d_u[i] = 0.;
		CS.d_multdof3_u[i].setZero();
	}

	for (unsigned int i = body_id; i > 0; i--) {
		if (i == body_id) {
			CS.d_pA[i] = -model.X_base[i].applyAdjoint(f_t[i]);
		}

		if (model.mJoints[i].mDoFCount == 3) {
			CS.d_multdof3_u[i] = - model.multdof3_S[i].transpose() * (CS.d_pA[i]);

			unsigned int lambda = model.lambda[i];
			if (lambda != 0) {
				CS.d_pA[lambda] = CS.d_pA[lambda] + model.X_lambda[i].applyTranspose (CS.d_pA[i] + model.multdof3_U[i] * model.multdof3_Dinv[i] * CS.d_multdof3_u[i]);
			}
		} else {
			CS.d_u[i] = - model.S[i].dot(CS.d_pA[i]);

			unsigned int lambda = model.lambda[i];
			if (lambda != 0) {
				CS.d_pA[lambda] = CS.d_pA[lambda] + model.X_lambda[i].applyTranspose (CS.d_pA[i] + model.U[i] * CS.d_u[i] / model.d[i]);
			}
		}
	}

	for (unsigned int i = 0; i < f_t.size(); i++) {
		LOG << "f_t[" << i << "] = " << f_t[i].transpose() << std::endl;
	}

	for (unsigned int i = 0; i < model.mBodies.size(); i++) {
		LOG << "i = " << i << ": d_pA[i] " << CS.d_pA[i].transpose() << std::endl;
	}
	for (unsigned int i = 0; i < model.mBodies.size(); i++) {
		LOG << "i = " << i << ": d_u[i] = " << CS.d_u[i] << std::endl;
	}

	QDDot_t[0] = 0.;
	CS.d_a[0] = model.a[0];

	for (unsigned int i = 1; i < model.mBodies.size(); i++) {
		unsigned int q_index = model.mJoints[i].q_index;
		unsigned int lambda = model.lambda[i];

		SpatialVector Xa = model.X_lambda[i].apply(CS.d_a[lambda]);

		if (model.mJoints[i].mDoFCount == 3) {
			Vector3d qdd_temp = model.multdof3_Dinv[i] * (CS.d_multdof3_u[i] - model.multdof3_U[i].transpose() * Xa);
			QDDot_t[q_index] = qdd_temp[0];
			QDDot_t[q_index + 1] = qdd_temp[1];
			QDDot_t[q_index + 2] = qdd_temp[2];
			model.a[i] = model.a[i] + model.multdof3_S[i] * qdd_temp;
			CS.d_a[i] = Xa + model.multdof3_S[i] * qdd_temp;
		} else {
			QDDot_t[q_index] = (CS.d_u[i] - model.U[i].dot(Xa) ) / model.d[i];
			CS.d_a[i] = Xa + model.S[i] * QDDot_t[q_index];
		}
	
		LOG << "QDDot_t[" << i - 1 << "] = " << QDDot_t[i - 1] << std::endl;
		LOG << "d_a[i] = " << CS.d_a[i].transpose() << std::endl;
	}
}